

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Resize
               (Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,uint32_t heightIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,uint32_t heightOut
               )

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  uchar *puVar7;
  ulong uVar8;
  ulong __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> positionX;
  allocator_type local_91;
  ulong local_90;
  uint32_t local_88;
  uint32_t local_84;
  ulong local_80;
  ulong local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  ImageTemplate<unsigned_char> local_58;
  
  local_90 = CONCAT44(local_90._4_4_,startXIn);
  local_84 = heightIn;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,widthIn,heightIn);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,widthOut,heightOut);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  local_88 = in->_rowSize;
  uVar1 = out->_rowSize;
  puVar2 = in->_data;
  local_78 = (ulong)(startYIn * local_88);
  local_80 = local_90 & 0xffffffff;
  local_90 = (ulong)(startYOut * uVar1);
  puVar6 = out->_data;
  __n = (ulong)widthOut;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,__n,&local_91);
  uVar4 = 0;
  for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
    uVar3 = uVar4 / widthOut;
    uVar4 = uVar4 + widthIn;
    local_70._M_impl.super__Vector_impl_data._M_start[uVar8] = uVar3;
  }
  iVar5 = 0;
  puVar6 = puVar6 + startXOut + local_90;
  puVar7 = puVar6 + uVar1 * heightOut;
  for (; puVar6 != puVar7; puVar6 = puVar6 + uVar1) {
    for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
      puVar6[uVar8] =
           puVar2[(ulong)local_70._M_impl.super__Vector_impl_data._M_start[uVar8] +
                  (ulong)(((iVar5 * local_84) / heightOut) * local_88) + local_80 + local_78];
    }
    iVar5 = iVar5 + 1;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
  return;
}

Assistant:

void Resize( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                 Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );
        VerifyGrayScaleImage( in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + heightOut * rowSizeOut;

        uint32_t idY = 0;

        // Precalculation of X position
        std::vector < uint32_t > positionX( widthOut );
        for( uint32_t x = 0; x < widthOut; ++x )
            positionX[x] = x * widthIn / widthOut;

        for( ; outY != outYEnd; outY += rowSizeOut, ++idY ) {
            const uint8_t * inX  = inY + (idY * heightIn / heightOut) * rowSizeIn;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + widthOut;

            const uint32_t * idX = positionX.data();

            for( ; outX != outXEnd; ++outX, ++idX )
                (*outX) = *(inX + (*idX));
        }
    }